

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::DynamicMapField::DeleteMapValue(DynamicMapField *this,MapKey *map_key)

{
  iterator pos;
  Node *pNVar1;
  iterator iter;
  iterator local_50;
  iterator local_38;
  
  MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find(&local_50,&this->map_,map_key);
  pNVar1 = local_50.it_.node_;
  if (local_50.it_.node_ != (Node *)0x0) {
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.state_ = 0;
    MapValueRef::DeleteData(&(((local_50.it_.node_)->kv).v_)->second);
    pos.it_.m_ = local_50.it_.m_;
    pos.it_.node_ = local_50.it_.node_;
    pos.it_.bucket_index_ = local_50.it_.bucket_index_;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase(&local_38,&this->map_,pos);
  }
  return pNVar1 != (Node *)0x0;
}

Assistant:

bool DynamicMapField::DeleteMapValue(const MapKey& map_key) {
  MapFieldBase::SyncMapWithRepeatedField();
  Map<MapKey, MapValueRef>::iterator iter = map_.find(map_key);
  if (iter == map_.end()) {
    return false;
  }
  // Set map dirty only if the delete is successful.
  MapFieldBase::SetMapDirty();
  iter->second.DeleteData();
  map_.erase(iter);
  return true;
}